

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startSampleList(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  undefined1 local_b8 [16];
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [16];
  char *local_88;
  char *local_80;
  undefined1 local_78 [8];
  qpXmlAttribute attribs [2];
  int numAttribs;
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  deMutex_lock(log->lock);
  qpSetStringAttrib((qpXmlAttribute *)local_98,"Name",name);
  local_78 = (undefined1  [8])local_98._0_8_;
  attribs[0].name = (char *)local_98._8_8_;
  attribs[0]._8_8_ = local_88;
  attribs[0].stringValue = local_80;
  qpSetStringAttrib((qpXmlAttribute *)local_b8,"Description",description);
  attribs[0].intValue = local_b8._0_4_;
  attribs[0].boolValue = local_b8._4_4_;
  attribs[1].name = (char *)local_b8._8_8_;
  attribs[1]._8_8_ = local_a8;
  attribs[1].stringValue = local_a0;
  dVar1 = qpXmlWriter_startElement(log->writer,"SampleList",2,(qpXmlAttribute *)local_78);
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_startSampleList(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_startSampleList (qpTestLog* log, const char* name, const char* description)
{
	int				numAttribs = 0;
	qpXmlAttribute	attribs[2];

	DE_ASSERT(log && name && description);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	if (!qpXmlWriter_startElement(log->writer, "SampleList", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startSampleList(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SAMPLELIST));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}